

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLChar.cpp
# Opt level: O0

void xercesc_4_0::XMLChar1_0::enableNELWS(void)

{
  if ((enableNEL & 1) == 0) {
    enableNEL = 1;
    s_HXHHH_XHHHHHMMXMMMMMMMMMMNHPHXHH_00545841[100] = DAT_0054582a;
    s_HXHHH_XHHHHHMMXMMMMMMMMMMNHPHXHH_00545841[0x2007] = DAT_0054582a;
  }
  return;
}

Assistant:

void XMLChar1_0::enableNELWS() {

    if (!enableNEL) {
        enableNEL = true;
        // When option is on, treat NEL same as LF
        fgCharCharsTable1_0[chNEL] = fgCharCharsTable1_0[chLF];

        // For simplicity, also treat 0x2028 same as LF
        fgCharCharsTable1_0[chLineSeparator] = fgCharCharsTable1_0[chLF];
    }
}